

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TetrahedralityParamDens.cpp
# Opt level: O1

void __thiscall OpenMD::TetrahedralityParamDens::process(TetrahedralityParamDens *this)

{
  double *pdVar1;
  int *piVar2;
  double dVar3;
  char cVar4;
  SimInfo *info;
  pointer piVar5;
  double dVar6;
  pointer pOVar7;
  pair<double,_OpenMD::StuntDouble_*> *ppVar8;
  iterator iVar9;
  uint i;
  int iVar10;
  uint uVar11;
  StuntDouble *pSVar12;
  StuntDouble *pSVar13;
  ulong uVar14;
  ostream *poVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  double tmp;
  vector<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
  myNeighbors;
  int isd2;
  int isd1;
  Vector3d rkj;
  Vector3d rik;
  Vector3d rk;
  Vector3d vec;
  Vector3d rj;
  Vector3d ri;
  DumpReader reader;
  SelectionSet local_1408;
  pair<double,_OpenMD::StuntDouble_*> *local_13e8;
  iterator iStack_13e0;
  pair<double,_OpenMD::StuntDouble_*> *local_13d8;
  double local_13d0;
  int local_13c8;
  int local_13c4;
  int local_13c0;
  int local_13bc;
  Vector3d local_13b8;
  Vector3d local_1398;
  SelectionManager *local_1378;
  SelectionManager *local_1370;
  double local_1368 [4];
  Vector3d local_1348;
  SelectionEvaluator *local_1330;
  SelectionEvaluator *local_1328;
  ulong local_1320;
  ulong local_1318;
  double local_1310;
  double local_1308 [4];
  double local_12e8 [4];
  double local_12c8 [4];
  double local_12a8 [4];
  DumpReader local_1288;
  
  local_1348.super_Vector<double,_3U>.data_[0] = 0.0;
  local_1348.super_Vector<double,_3U>.data_[1] = 0.0;
  local_1348.super_Vector<double,_3U>.data_[2] = 0.0;
  local_12e8[2] = 0.0;
  local_12e8[0] = 0.0;
  local_12e8[1] = 0.0;
  local_1308[2] = 0.0;
  local_1308[0] = 0.0;
  local_1308[1] = 0.0;
  local_1368[2] = 0.0;
  local_1368[0] = 0.0;
  local_1368[1] = 0.0;
  local_1398.super_Vector<double,_3U>.data_[2] = 0.0;
  local_1398.super_Vector<double,_3U>.data_[0] = 0.0;
  local_1398.super_Vector<double,_3U>.data_[1] = 0.0;
  local_13b8.super_Vector<double,_3U>.data_[2] = 0.0;
  local_13b8.super_Vector<double,_3U>.data_[0] = 0.0;
  local_13b8.super_Vector<double,_3U>.data_[1] = 0.0;
  local_13d8 = (pair<double,_OpenMD::StuntDouble_*> *)0x0;
  local_13e8 = (pair<double,_OpenMD::StuntDouble_*> *)0x0;
  iStack_13e0._M_current = (pair<double,_OpenMD::StuntDouble_*> *)0x0;
  info = (this->super_StaticAnalyser).info_;
  cVar4 = (info->simParams_->UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b;
  DumpReader::DumpReader(&local_1288,info,&(this->super_StaticAnalyser).dumpFilename_);
  iVar10 = DumpReader::getNFrames(&local_1288);
  if (0 < iVar10) {
    local_1328 = &this->evaluator1_;
    local_1330 = &this->evaluator2_;
    local_1378 = &this->seleMan1_;
    local_1370 = &this->seleMan2_;
    uVar14 = 0;
    local_13c4 = iVar10;
    do {
      local_1320 = uVar14;
      DumpReader::readFrame(&local_1288,(int)uVar14);
      this->currentSnapshot_ = ((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
      if ((this->evaluator1_).isDynamic_ == true) {
        SelectionEvaluator::evaluate(&local_1408,local_1328);
        lVar18 = 0;
        do {
          std::vector<bool,_std::allocator<bool>_>::operator=
                    ((vector<bool,_std::allocator<bool>_> *)
                     ((long)&(((this->seleMan1_).ss_.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                             super__Bvector_base<std::allocator<bool>_> + lVar18),
                     (vector<bool,_std::allocator<bool>_> *)
                     ((long)&((local_1408.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                     lVar18));
          lVar18 = lVar18 + 0x28;
        } while (lVar18 != 0xf0);
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                  (&local_1408.bitsets_);
      }
      if ((this->evaluator2_).isDynamic_ == true) {
        SelectionEvaluator::evaluate(&local_1408,local_1330);
        lVar18 = 0;
        do {
          std::vector<bool,_std::allocator<bool>_>::operator=
                    ((vector<bool,_std::allocator<bool>_> *)
                     ((long)&(((this->seleMan2_).ss_.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                             super__Bvector_base<std::allocator<bool>_> + lVar18),
                     (vector<bool,_std::allocator<bool>_> *)
                     ((long)&((local_1408.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                     lVar18));
          lVar18 = lVar18 + 0x28;
        } while (lVar18 != 0xf0);
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                  (&local_1408.bitsets_);
      }
      pSVar12 = SelectionManager::beginSelected(local_1378,&local_13bc);
      while (pSVar12 != (StuntDouble *)0x0) {
        if (iStack_13e0._M_current != local_13e8) {
          iStack_13e0._M_current = local_13e8;
        }
        iVar10 = pSVar12->globalIndex_;
        pSVar13 = SelectionManager::beginSelected(local_1370,&local_13c0);
        while (iVar9._M_current = iStack_13e0._M_current, ppVar8 = local_13e8,
              pSVar13 != (StuntDouble *)0x0) {
          if (pSVar13->globalIndex_ != iVar10) {
            lVar18 = *(long *)((long)&(pSVar12->snapshotMan_->currentSnapshot_->atomData).position.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + pSVar12->storage_)
            ;
            local_12a8[2] =
                 (double)*(undefined8 *)(lVar18 + 0x10 + (long)pSVar12->localIndex_ * 0x18);
            pdVar1 = (double *)(lVar18 + (long)pSVar12->localIndex_ * 0x18);
            local_12a8[0] = *pdVar1;
            local_12a8[1] = pdVar1[1];
            lVar18 = *(long *)((long)&(pSVar13->snapshotMan_->currentSnapshot_->atomData).position.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + pSVar13->storage_)
            ;
            local_12c8[2] =
                 (double)*(undefined8 *)(lVar18 + 0x10 + (long)pSVar13->localIndex_ * 0x18);
            pdVar1 = (double *)(lVar18 + (long)pSVar13->localIndex_ * 0x18);
            local_12c8[0] = *pdVar1;
            local_12c8[1] = pdVar1[1];
            local_1408.bitsets_.
            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_1408.bitsets_.
            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_1408.bitsets_.
            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            lVar18 = 0;
            do {
              (&local_1408.bitsets_.
                super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                _M_impl.super__Vector_impl_data._M_start)[lVar18] =
                   (pointer)(local_12a8[lVar18] - local_12c8[lVar18]);
              lVar18 = lVar18 + 1;
            } while (lVar18 != 3);
            local_1348.super_Vector<double,_3U>.data_[2] =
                 (double)local_1408.bitsets_.
                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_1348.super_Vector<double,_3U>.data_[0] =
                 (double)local_1408.bitsets_.
                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            local_1348.super_Vector<double,_3U>.data_[1] =
                 (double)local_1408.bitsets_.
                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
            if (cVar4 != '\0') {
              Snapshot::wrapVector(this->currentSnapshot_,&local_1348);
            }
            dVar6 = 0.0;
            lVar18 = 0;
            do {
              dVar3 = local_1348.super_Vector<double,_3U>.data_[lVar18];
              dVar6 = dVar6 + dVar3 * dVar3;
              lVar18 = lVar18 + 1;
            } while (lVar18 != 3);
            if (dVar6 < 0.0) {
              pOVar7 = (pointer)sqrt(dVar6);
            }
            else {
              pOVar7 = (pointer)SQRT(dVar6);
            }
            if ((double)pOVar7 < this->rCut_) {
              local_1408.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start = pOVar7;
              local_1408.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)pSVar13;
              if (iStack_13e0._M_current == local_13d8) {
                std::
                vector<std::pair<double,OpenMD::StuntDouble*>,std::allocator<std::pair<double,OpenMD::StuntDouble*>>>
                ::_M_realloc_insert<std::pair<double,OpenMD::StuntDouble*>>
                          ((vector<std::pair<double,OpenMD::StuntDouble*>,std::allocator<std::pair<double,OpenMD::StuntDouble*>>>
                            *)&local_13e8,iStack_13e0,
                           (pair<double,_OpenMD::StuntDouble_*> *)&local_1408);
              }
              else {
                (iStack_13e0._M_current)->first = (double)pOVar7;
                (iStack_13e0._M_current)->second = pSVar13;
                iStack_13e0._M_current = iStack_13e0._M_current + 1;
              }
            }
          }
          pSVar13 = SelectionManager::nextSelected(local_1370,&local_13c0);
        }
        if (local_13e8 != iStack_13e0._M_current) {
          uVar14 = (long)iStack_13e0._M_current - (long)local_13e8 >> 4;
          lVar18 = 0x3f;
          if (uVar14 != 0) {
            for (; uVar14 >> lVar18 == 0; lVar18 = lVar18 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<double,OpenMD::StuntDouble*>*,std::vector<std::pair<double,OpenMD::StuntDouble*>,std::allocator<std::pair<double,OpenMD::StuntDouble*>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (local_13e8,iStack_13e0._M_current,((uint)lVar18 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<double,OpenMD::StuntDouble*>*,std::vector<std::pair<double,OpenMD::StuntDouble*>,std::allocator<std::pair<double,OpenMD::StuntDouble*>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (ppVar8,iVar9._M_current);
        }
        uVar16 = (long)iStack_13e0._M_current - (long)local_13e8 >> 4;
        uVar14 = 4;
        if (uVar16 < 4) {
          uVar14 = uVar16;
        }
        uVar11 = (int)uVar14 - 1;
        lVar18 = *(long *)((long)&(pSVar12->snapshotMan_->currentSnapshot_->atomData).position.
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + pSVar12->storage_);
        pdVar1 = (double *)(lVar18 + (long)pSVar12->localIndex_ * 0x18);
        local_1368[0] = *pdVar1;
        local_1368[1] = pdVar1[1];
        local_1368[2] = (double)*(undefined8 *)(lVar18 + 0x10 + (long)pSVar12->localIndex_ * 0x18);
        local_13c8 = (int)((double)(int)(uVar11 * (int)uVar14) * 0.5);
        local_13d0 = 1.0;
        if (1 < uVar16) {
          local_1310 = (double)local_13c8;
          local_1318 = (ulong)uVar11;
          uVar16 = 1;
          uVar19 = 0;
          local_13d0 = 1.0;
          do {
            pSVar12 = local_13e8[uVar19].second;
            lVar18 = *(long *)((long)&(pSVar12->snapshotMan_->currentSnapshot_->atomData).position.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + pSVar12->storage_)
            ;
            pdVar1 = (double *)(lVar18 + (long)pSVar12->localIndex_ * 0x18);
            local_12e8[0] = *pdVar1;
            local_12e8[1] = pdVar1[1];
            local_12e8[2] =
                 (double)*(undefined8 *)(lVar18 + 0x10 + (long)pSVar12->localIndex_ * 0x18);
            local_1408.bitsets_.
            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_1408.bitsets_.
            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_1408.bitsets_.
            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            lVar18 = 0;
            do {
              (&local_1408.bitsets_.
                super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                _M_impl.super__Vector_impl_data._M_start)[lVar18] =
                   (pointer)(local_1368[lVar18] - local_12e8[lVar18]);
              lVar18 = lVar18 + 1;
            } while (lVar18 != 3);
            local_1398.super_Vector<double,_3U>.data_[2] =
                 (double)local_1408.bitsets_.
                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_1398.super_Vector<double,_3U>.data_[0] =
                 (double)local_1408.bitsets_.
                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            local_1398.super_Vector<double,_3U>.data_[1] =
                 (double)local_1408.bitsets_.
                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
            if (cVar4 != '\0') {
              Snapshot::wrapVector(this->currentSnapshot_,&local_1398);
            }
            dVar6 = 0.0;
            lVar18 = 0;
            do {
              dVar3 = local_1398.super_Vector<double,_3U>.data_[lVar18];
              dVar6 = dVar6 + dVar3 * dVar3;
              lVar18 = lVar18 + 1;
            } while (lVar18 != 3);
            if (dVar6 < 0.0) {
              dVar6 = sqrt(dVar6);
            }
            else {
              dVar6 = SQRT(dVar6);
            }
            lVar18 = 0;
            do {
              local_1398.super_Vector<double,_3U>.data_[lVar18] =
                   local_1398.super_Vector<double,_3U>.data_[lVar18] / dVar6;
              lVar18 = lVar18 + 1;
            } while (lVar18 != 3);
            uVar19 = uVar19 + 1;
            uVar17 = uVar16;
            if (uVar19 < uVar14) {
              do {
                pSVar12 = local_13e8[uVar17].second;
                lVar18 = *(long *)((long)&(pSVar12->snapshotMan_->currentSnapshot_->atomData).
                                          position.
                                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start +
                                  pSVar12->storage_);
                pdVar1 = (double *)(lVar18 + (long)pSVar12->localIndex_ * 0x18);
                local_1308[0] = *pdVar1;
                local_1308[1] = pdVar1[1];
                local_1308[2] =
                     (double)*(undefined8 *)(lVar18 + 0x10 + (long)pSVar12->localIndex_ * 0x18);
                local_1408.bitsets_.
                super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_1408.bitsets_.
                super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_1408.bitsets_.
                super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                lVar18 = 0;
                do {
                  (&local_1408.bitsets_.
                    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                    _M_impl.super__Vector_impl_data._M_start)[lVar18] =
                       (pointer)(local_1368[lVar18] - local_1308[lVar18]);
                  lVar18 = lVar18 + 1;
                } while (lVar18 != 3);
                local_13b8.super_Vector<double,_3U>.data_[2] =
                     (double)local_1408.bitsets_.
                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
                local_13b8.super_Vector<double,_3U>.data_[0] =
                     (double)local_1408.bitsets_.
                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                local_13b8.super_Vector<double,_3U>.data_[1] =
                     (double)local_1408.bitsets_.
                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                if (cVar4 != '\0') {
                  Snapshot::wrapVector(this->currentSnapshot_,&local_13b8);
                }
                dVar6 = 0.0;
                lVar18 = 0;
                do {
                  dVar3 = local_13b8.super_Vector<double,_3U>.data_[lVar18];
                  dVar6 = dVar6 + dVar3 * dVar3;
                  lVar18 = lVar18 + 1;
                } while (lVar18 != 3);
                if (dVar6 < 0.0) {
                  dVar6 = sqrt(dVar6);
                }
                else {
                  dVar6 = SQRT(dVar6);
                }
                lVar18 = 0;
                do {
                  local_13b8.super_Vector<double,_3U>.data_[lVar18] =
                       local_13b8.super_Vector<double,_3U>.data_[lVar18] / dVar6;
                  lVar18 = lVar18 + 1;
                } while (lVar18 != 3);
                dVar6 = 0.0;
                lVar18 = 0;
                do {
                  dVar6 = dVar6 + local_1398.super_Vector<double,_3U>.data_[lVar18] *
                                  local_13b8.super_Vector<double,_3U>.data_[lVar18];
                  lVar18 = lVar18 + 1;
                } while (lVar18 != 3);
                local_13d0 = local_13d0 +
                             ((dVar6 + 0.3333333333333333) * (dVar6 + 0.3333333333333333) * -2.25) /
                             local_1310;
                uVar17 = uVar17 + 1;
              } while (uVar17 != uVar14);
            }
            uVar16 = uVar16 + 1;
          } while (uVar19 != local_1318);
        }
        iVar10 = local_13c4;
        if (0 < local_13c8) {
          uVar11 = (uint)((local_13d0 - this->MinQ_) / this->deltaQ_);
          if (((int)uVar11 < 0) ||
             (piVar5 = (this->sliceCount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,
             (int)((ulong)((long)(this->sliceCount_).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)piVar5) >> 2) <=
             (int)uVar11)) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"binNo = ",8);
            poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,uVar11);
            std::__ostream_insert<char,std::char_traits<char>>(poVar15," Qk = ",6);
            poVar15 = std::ostream::_M_insert<double>(local_13d0);
            std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
          }
          else {
            piVar2 = piVar5 + uVar11;
            *piVar2 = *piVar2 + 1;
          }
          this->count_ = this->count_ + 1;
        }
        pSVar12 = SelectionManager::nextSelected(local_1378,&local_13bc);
      }
      uVar11 = (int)local_1320 + (this->super_StaticAnalyser).step_;
      uVar14 = (ulong)uVar11;
    } while ((int)uVar11 < iVar10);
  }
  writeQdens(this);
  DumpReader::~DumpReader(&local_1288);
  if (local_13e8 != (pair<double,_OpenMD::StuntDouble_*> *)0x0) {
    operator_delete(local_13e8,(long)local_13d8 - (long)local_13e8);
  }
  return;
}

Assistant:

void TetrahedralityParamDens::process() {
    StuntDouble* sd;
    StuntDouble* sd2;
    StuntDouble* sdi;
    StuntDouble* sdj;
    int myIndex;
    Vector3d vec;
    Vector3d ri, rj, rk, rik, rkj;
    RealType r;
    RealType cospsi;
    RealType Qk;
    std::vector<std::pair<RealType, StuntDouble*>> myNeighbors;
    int isd1;
    int isd2;
    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      // Mat3x3d hmat = currentSnapshot_->getHmat();
      // zBox_.push_back(hmat(2,2));

      // RealType halfBoxZ_ = hmat(2,2) / 2.0;

      if (evaluator1_.isDynamic()) {
        seleMan1_.setSelectionSet(evaluator1_.evaluate());
      }

      if (evaluator2_.isDynamic()) {
        seleMan2_.setSelectionSet(evaluator2_.evaluate());
      }

      // outer loop is over the selected StuntDoubles:
      for (sd = seleMan1_.beginSelected(isd1); sd != NULL;
           sd = seleMan1_.nextSelected(isd1)) {
        myIndex = sd->getGlobalIndex();

        Qk = 1.0;
        myNeighbors.clear();

        for (sd2 = seleMan2_.beginSelected(isd2); sd2 != NULL;
             sd2 = seleMan2_.nextSelected(isd2)) {
          if (sd2->getGlobalIndex() != myIndex) {
            vec = sd->getPos() - sd2->getPos();

            if (usePeriodicBoundaryConditions_)
              currentSnapshot_->wrapVector(vec);

            r = vec.length();

            // Check to see if neighbor is in bond cutoff

            if (r < rCut_) {
              myNeighbors.push_back(std::make_pair(r, sd2));
              if (myIndex == 513) {
                // std::cerr<< "sd2 index = " << sd2->getGlobalIndex() << "\n";
              }
            }
          }
        }

        // Sort the vector using predicate and std::sort
        std::sort(myNeighbors.begin(), myNeighbors.end());

        // Use only the 4 closest neighbors to do the rest of the work:

        int nbors = myNeighbors.size() > 4 ? 4 : myNeighbors.size();
        int nang  = int(0.5 * (nbors * (nbors - 1)));
        if (nang < 4) {
          // std::cerr << "nbors = " << nbors << " nang = " << nang << "\n";
        }
        rk = sd->getPos();

        for (int i = 0; i < nbors - 1; i++) {
          sdi = myNeighbors[i].second;
          ri  = sdi->getPos();
          rik = rk - ri;
          if (usePeriodicBoundaryConditions_) currentSnapshot_->wrapVector(rik);

          rik.normalize();

          for (int j = i + 1; j < nbors; j++) {
            sdj = myNeighbors[j].second;
            rj  = sdj->getPos();
            rkj = rk - rj;
            if (usePeriodicBoundaryConditions_)
              currentSnapshot_->wrapVector(rkj);
            rkj.normalize();

            cospsi = dot(rik, rkj);

            // Calculates scaled Qk for each molecule using calculated
            // angles from 4 or fewer nearest neighbors.
            Qk -= (pow(cospsi + 1.0 / 3.0, 2) * 2.25 / nang);
            /*if (Qk < 0 ) {
            std::cerr << "(pow(cospsi + 1.0 / 3.0, 2) * 2.25 / nang)" <<
            (pow(cospsi + 1.0 / 3.0, 2) * 2.25 / nang) << "\n"; std::cerr << "Qk
            = " << Qk << " nang = " << nang <<  " nbors = " << nbors << "\n";
            std::cerr << "myIndex = " << myIndex <<
            "\n";
            }*/
          }
        }

        // Based on the molecule's q value, populate the histogram.
        if (nang > 0) {
          int binNo = int((Qk - MinQ_) / deltaQ_);

          if (binNo < int(sliceCount_.size()) && binNo >= 0) {
            sliceCount_[binNo] += 1;
          } else {
            std::cerr << "binNo = " << binNo << " Qk = " << Qk << "\n";
            // std::cerr << "nbors = " << nbors << "\n";
          }

          // std::cout << "count = " << count_ << "\n";
          count_++;
        }
      }
    }
    writeQdens();
  }